

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Lathe.H
# Opt level: O0

Real __thiscall
amrex::EB2::
LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>
::operator()(LatheIF<amrex::EB2::UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>_>
             *this,RealArray *p)

{
  const_reference pvVar1;
  Real RVar2;
  Real r;
  RealArray *in_stack_ffffffffffffffb8;
  array<double,_3UL> *in_stack_ffffffffffffffc0;
  UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>
  *this_00;
  
  pvVar1 = std::array<double,_3UL>::operator[]
                     (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8);
  this_00 = (UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>
             *)*pvVar1;
  pvVar1 = std::array<double,_3UL>::operator[]
                     ((array<double,_3UL> *)this_00,(size_type)in_stack_ffffffffffffffb8);
  hypot((double)this_00,*pvVar1);
  std::array<double,_3UL>::operator[]
            ((array<double,_3UL> *)this_00,(size_type)in_stack_ffffffffffffffb8);
  RVar2 = UnionIF<amrex::EB2::PlaneIF,_amrex::EB2::IntersectionIF<amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF,_amrex::EB2::PlaneIF>,_amrex::EB2::BoxIF,_amrex::EB2::BoxIF>
          ::operator()(this_00,in_stack_ffffffffffffffb8);
  return RVar2;
}

Assistant:

inline Real operator() (const RealArray& p) const noexcept
    {
        Real r = std::hypot(p[0],p[1]);
#if (AMREX_SPACEDIM == 2)
        return m_f({r,0.0});
#else
        return m_f({r,p[2],0.0});
#endif
    }